

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O1

void duckdb::TupleDataListScatter
               (Vector *source,TupleDataVectorFormat *source_format,SelectionVector *append_sel,
               idx_t append_count,TupleDataLayout *layout,Vector *row_locations,
               Vector *heap_locations,idx_t col_idx,UnifiedVectorFormat *param_9,
               vector<duckdb::TupleDataScatterFunction,_true> *child_functions)

{
  byte *pbVar1;
  SelectionVector *pSVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  data_ptr_t pdVar5;
  value_type vVar6;
  sel_t *psVar7;
  unsigned_long *puVar8;
  byte bVar9;
  const_reference pvVar10;
  Vector *pVVar11;
  const_reference pvVar12;
  const_reference pvVar13;
  idx_t iVar14;
  idx_t iVar15;
  
  pSVar2 = (source_format->unified).sel;
  pdVar3 = (source_format->unified).data;
  pdVar4 = row_locations->data;
  pdVar5 = heap_locations->data;
  pvVar10 = vector<unsigned_long,_true>::operator[](&layout->offsets,col_idx);
  if (append_count != 0) {
    vVar6 = *pvVar10;
    bVar9 = (byte)col_idx & 7;
    iVar14 = 0;
    do {
      iVar15 = iVar14;
      if (append_sel->sel_vector != (sel_t *)0x0) {
        iVar15 = (idx_t)append_sel->sel_vector[iVar14];
      }
      psVar7 = pSVar2->sel_vector;
      if (psVar7 != (sel_t *)0x0) {
        iVar15 = (idx_t)psVar7[iVar15];
      }
      puVar8 = (source_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
               validity_mask;
      if ((puVar8 == (unsigned_long *)0x0) || ((puVar8[iVar15 >> 6] >> (iVar15 & 0x3f) & 1) != 0)) {
        *(undefined8 *)(*(long *)(pdVar4 + iVar14 * 8) + vVar6) =
             *(undefined8 *)(pdVar5 + iVar14 * 8);
        **(undefined8 **)(pdVar5 + iVar14 * 8) = *(undefined8 *)(pdVar3 + iVar15 * 0x10 + 8);
        *(long *)(pdVar5 + iVar14 * 8) = *(long *)(pdVar5 + iVar14 * 8) + 8;
      }
      else {
        pbVar1 = (byte *)(*(long *)(pdVar4 + iVar14 * 8) + (col_idx >> 3));
        *pbVar1 = *pbVar1 & (-2 << bVar9 | 0xfeU >> 8 - bVar9);
      }
      iVar14 = iVar14 + 1;
    } while (append_count != iVar14);
  }
  pVVar11 = ListVector::GetEntry(source);
  pvVar12 = vector<duckdb::TupleDataVectorFormat,_true>::operator[](&source_format->children,0);
  pvVar13 = vector<duckdb::TupleDataScatterFunction,_true>::operator[](child_functions,0);
  (*pvVar13->function)
            (pVVar11,pvVar12,append_sel,append_count,layout,row_locations,heap_locations,col_idx,
             &source_format->unified,&pvVar13->child_functions);
  return;
}

Assistant:

static void TupleDataListScatter(const Vector &source, const TupleDataVectorFormat &source_format,
                                 const SelectionVector &append_sel, const idx_t append_count,
                                 const TupleDataLayout &layout, const Vector &row_locations, Vector &heap_locations,
                                 const idx_t col_idx, const UnifiedVectorFormat &,
                                 const vector<TupleDataScatterFunction> &child_functions) {
	// Source
	const auto &source_data = source_format.unified;
	const auto &source_sel = *source_data.sel;
	const auto data = UnifiedVectorFormat::GetData<list_entry_t>(source_data);
	const auto &validity = source_data.validity;

	// Target
	const auto target_locations = FlatVector::GetData<data_ptr_t>(row_locations);
	const auto target_heap_locations = FlatVector::GetData<data_ptr_t>(heap_locations);

	// Precompute mask indexes
	idx_t entry_idx;
	idx_t idx_in_entry;
	ValidityBytes::GetEntryIndex(col_idx, entry_idx, idx_in_entry);

	// Set validity of the LIST in this layout, and store pointer to where it's stored
	const auto offset_in_row = layout.GetOffsets()[col_idx];
	for (idx_t i = 0; i < append_count; i++) {
		const auto source_idx = source_sel.get_index(append_sel.get_index(i));
		if (validity.RowIsValid(source_idx)) {
			auto &target_heap_location = target_heap_locations[i];
			Store<data_ptr_t>(target_heap_location, target_locations[i] + offset_in_row);

			// Store list length and skip over it
			Store<uint64_t>(data[source_idx].length, target_heap_location);
			target_heap_location += sizeof(uint64_t);
		} else {
			ValidityBytes(target_locations[i], layout.ColumnCount()).SetInvalidUnsafe(entry_idx, idx_in_entry);
		}
	}

	// Recurse
	D_ASSERT(child_functions.size() == 1);
	auto &child_source = ListVector::GetEntry(source);
	auto &child_format = source_format.children[0];
	const auto &child_function = child_functions[0];
	child_function.function(child_source, child_format, append_sel, append_count, layout, row_locations, heap_locations,
	                        col_idx, source_format.unified, child_function.child_functions);
}